

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O0

Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
GuiScope::writeExport
          (Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GuiScope *this,string_view config,UniformsMap *uniforms)

{
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  UniformsMap *local_30;
  UniformsMap *uniforms_local;
  GuiScope *this_local;
  string_view config_local;
  
  config_local._M_len = (size_t)config._M_str;
  this_local = (GuiScope *)config._M_len;
  local_30 = uniforms;
  uniforms_local = (UniformsMap *)this;
  config_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Not implemented",&local_71);
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Unexpected(&local_50,&local_70);
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Expected(__return_storage_ptr__,&local_50);
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Unexpected(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

Expected<IAutomation::ExportResult, std::string> GuiScope::writeExport(std::string_view config, const shader::UniformsMap &uniforms) const {
	return Unexpected(std::string("Not implemented"));
}